

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand48.cc
# Opt level: O0

float merand48_noadvance(uint64_t v)

{
  float fVar1;
  
  fVar1 = merand48((uint64_t *)v);
  return fVar1;
}

Assistant:

float merand48_noadvance(uint64_t v) { return merand48(v); }